

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O0

void __thiscall Prog::process_key_char(Prog *this,int unichar)

{
  int iVar1;
  SampleInstance *this_00;
  SampleInstance *pSVar2;
  vector<const_Sample_*,_std::allocator<const_Sample_*>_> *this_01;
  int in_ESI;
  long in_RDI;
  Prog *in_stack_00000008;
  Prog *in_stack_00000010;
  SampleInstance *splinst;
  uint n;
  int upper;
  Sample *spl;
  Prog *in_stack_ffffffffffffffe0;
  
  iVar1 = toupper(in_ESI);
  if (iVar1 == 0x56) {
    new_voice((Prog *)CONCAT44(in_ESI,0x56));
  }
  else if (iVar1 == 0x4d) {
    new_mixer(in_stack_ffffffffffffffe0);
  }
  else if (iVar1 == 0x53) {
    new_sample_instance((Prog *)CONCAT44(in_ESI,0x53));
  }
  else if (iVar1 == 0x41) {
    new_audiostream(in_stack_00000008);
  }
  else if (iVar1 == 0x20) {
    if (*(long *)(in_RDI + 0xb8) != 0) {
      (**(code **)(**(long **)(in_RDI + 0xb8) + 0x18))();
    }
  }
  else if (iVar1 == 0x58) {
    if (*(long *)(in_RDI + 0xb8) != 0) {
      delete_element(in_stack_00000010,(Element *)in_stack_00000008);
      *(undefined8 *)(in_RDI + 0xb8) = 0;
    }
  }
  else if ((0x30 < iVar1) && (iVar1 < 0x3a)) {
    this_00 = (SampleInstance *)(ulong)(iVar1 - 0x31);
    pSVar2 = (SampleInstance *)
             std::vector<const_Sample_*,_std::allocator<const_Sample_*>_>::size
                       ((vector<const_Sample_*,_std::allocator<const_Sample_*>_> *)(in_RDI + 0x68));
    if (this_00 < pSVar2) {
      spl = *(Sample **)(in_RDI + 0xb8);
      if (spl == (Sample *)0x0) {
        this_01 = (vector<const_Sample_*,_std::allocator<const_Sample_*>_> *)0x0;
      }
      else {
        this_01 = (vector<const_Sample_*,_std::allocator<const_Sample_*>_> *)
                  __dynamic_cast(spl,&Element::typeinfo,&SampleInstance::typeinfo,0);
      }
      if (this_01 != (vector<const_Sample_*,_std::allocator<const_Sample_*>_> *)0x0) {
        std::vector<const_Sample_*,_std::allocator<const_Sample_*>_>::at(this_01,(size_type)this_01)
        ;
        SampleInstance::set_sample(this_00,spl);
      }
    }
  }
  return;
}

Assistant:

void Prog::process_key_char(int unichar)
{
   int upper = toupper(unichar);
   if (upper == 'V') {
      new_voice();
   }
   else if (upper == 'M') {
      new_mixer();
   }
   else if (upper == 'S') {
      new_sample_instance();
   }
   else if (upper == 'A') {
      new_audiostream();
   }
   else if (upper == ' ') {
      if (cur_element) {
         cur_element->toggle_playing();
      }
   }
   else if (upper == 'X') {
      if (cur_element) {
         delete_element(cur_element);
         cur_element = NULL;
      }
   }
   else if (upper >= '1' && upper <= '9') {
      unsigned n = upper - '1';
      SampleInstance *splinst;
      if (n < samples.size() &&
         (splinst = dynamic_cast<SampleInstance *>(cur_element)))
      {
         splinst->set_sample(*samples.at(n));
      }
   }
}